

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_ftn_entry.h
# Opt level: O0

size_t omp_capture_affinity(char *buffer,char *format,size_t buf_size,size_t for_size)

{
  int iVar1;
  size_t sVar2;
  long in_RDX;
  long in_RDI;
  ConvertedString cformat;
  kmp_str_buf_t capture_buf;
  size_t num_required;
  int gtid;
  size_t in_stack_fffffffffffffda0;
  undefined4 in_stack_fffffffffffffda8;
  undefined4 in_stack_fffffffffffffdac;
  ConvertedString *in_stack_fffffffffffffdb0;
  kmp_info_t *in_stack_fffffffffffffdb8;
  char *buffer_00;
  char local_230 [496];
  kmp_str_buf_t *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  undefined8 in_stack_ffffffffffffffd0;
  int gtid_00;
  
  gtid_00 = (int)((ulong)in_stack_ffffffffffffffd0 >> 0x20);
  if (__kmp_init_middle == 0) {
    __kmp_middle_initialize();
  }
  iVar1 = __kmp_get_global_thread_id();
  buffer_00 = local_230;
  local_230[0] = '\0';
  ConvertedString::ConvertedString
            (in_stack_fffffffffffffdb0,
             (char *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8),
             in_stack_fffffffffffffda0);
  ConvertedString::get((ConvertedString *)&stack0xfffffffffffffdb0);
  sVar2 = __kmp_aux_capture_affinity(gtid_00,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  if ((in_RDI != 0) && (in_RDX != 0)) {
    __kmp_fortran_strncpy_truncate
              (buffer_00,(size_t)in_stack_fffffffffffffdb8,(char *)in_stack_fffffffffffffdb0,
               CONCAT44(iVar1,in_stack_fffffffffffffda8));
  }
  __kmp_str_buf_free((kmp_str_buf_t *)0x1cb300);
  ConvertedString::~ConvertedString((ConvertedString *)0x1cb317);
  return sVar2;
}

Assistant:

size_t FTN_STDCALL FTN_CAPTURE_AFFINITY(char *buffer, char const *format,
                                        size_t buf_size, size_t for_size) {
#if defined(KMP_STUB)
  return 0;
#else
  int gtid;
  size_t num_required;
  kmp_str_buf_t capture_buf;
  if (!TCR_4(__kmp_init_middle)) {
    __kmp_middle_initialize();
  }
  gtid = __kmp_get_gtid();
  __kmp_str_buf_init(&capture_buf);
  ConvertedString cformat(format, for_size);
  num_required = __kmp_aux_capture_affinity(gtid, cformat.get(), &capture_buf);
  if (buffer && buf_size) {
    __kmp_fortran_strncpy_truncate(buffer, buf_size, capture_buf.str,
                                   capture_buf.used);
  }
  __kmp_str_buf_free(&capture_buf);
  return num_required;
#endif
}